

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Error addBinding(XML_Parser parser,PREFIX *prefix,ATTRIBUTE_ID *attId,XML_Char *uri,
                    BINDING **bindingsPtr)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  long lVar5;
  char cVar6;
  XML_Char *__dest;
  BINDING *pBVar7;
  BINDING *pBVar8;
  bool bVar9;
  XML_Error XVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  
  cVar6 = *uri;
  pcVar1 = prefix->name;
  XVar10 = XML_ERROR_RESERVED_NAMESPACE_URI;
  if (cVar6 == '\0') {
    if (pcVar1 != (char *)0x0) {
      return XML_ERROR_UNDECLARING_PREFIX;
    }
  }
  else if ((((pcVar1 != (char *)0x0) && (*pcVar1 == 'x')) && (pcVar1[1] == 'm')) &&
          (pcVar1[2] == 'l')) {
    if (pcVar1[3] == '\0') {
      bVar9 = true;
      XVar10 = XML_ERROR_RESERVED_PREFIX_XML;
      bVar4 = 0;
      goto LAB_00169f60;
    }
    if (((pcVar1[3] == 'n') && (pcVar1[4] == 's')) && (pcVar1[5] == '\0')) {
      return XML_ERROR_RESERVED_PREFIX_XMLNS;
    }
  }
  bVar4 = 1;
  bVar9 = false;
LAB_00169f60:
  bVar2 = true;
  uVar11 = 0;
  bVar3 = true;
  while (cVar6 != '\0') {
    if (((!bVar2) || (0x24 < uVar11)) || (cVar6 != "http://www.w3.org/XML/1998/namespace"[uVar11]))
    {
      bVar2 = false;
    }
    if (((bool)(bVar3 & bVar4)) &&
       ((0x1d < uVar11 || (cVar6 != "http://www.w3.org/2000/xmlns/"[uVar11])))) {
      bVar3 = false;
    }
    if ((parser->m_ns != '\0') && (cVar6 == parser->m_namespaceSeparator)) {
      switch(cVar6) {
      case '!':
      case '#':
      case '$':
      case '%':
      case '&':
      case '\'':
      case '(':
      case ')':
      case '*':
      case '+':
      case ',':
      case '-':
      case '.':
      case '/':
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
      case ':':
      case ';':
      case '=':
      case '?':
      case '@':
      case 'A':
      case 'B':
      case 'C':
      case 'D':
      case 'E':
      case 'F':
      case 'G':
      case 'H':
      case 'I':
      case 'J':
      case 'K':
      case 'L':
      case 'M':
      case 'N':
      case 'O':
      case 'P':
      case 'Q':
      case 'R':
      case 'S':
      case 'T':
      case 'U':
      case 'V':
      case 'W':
      case 'X':
      case 'Y':
      case 'Z':
      case '[':
      case ']':
      case '_':
      case 'a':
      case 'b':
      case 'c':
      case 'd':
      case 'e':
      case 'f':
      case 'g':
      case 'h':
      case 'i':
      case 'j':
      case 'k':
      case 'l':
      case 'm':
      case 'n':
      case 'o':
      case 'p':
      case 'q':
      case 'r':
      case 's':
      case 't':
      case 'u':
      case 'v':
      case 'w':
      case 'x':
      case 'y':
      case 'z':
      case '~':
        break;
      default:
        return XML_ERROR_SYNTAX;
      }
    }
    lVar5 = uVar11 + 1;
    uVar11 = uVar11 + 1;
    cVar6 = uri[lVar5];
  }
  if (bVar9 == (uVar11 == 0x24 && bVar2)) {
    if (bVar3 && uVar11 == 0x1d) {
      XVar10 = XML_ERROR_RESERVED_NAMESPACE_URI;
    }
    else {
      cVar6 = parser->m_namespaceSeparator;
      uVar13 = (uVar11 + 1) - (ulong)(cVar6 == '\0');
      pBVar7 = parser->m_freeBindingList;
      uVar12 = (uint)uVar13;
      if (pBVar7 == (BINDING *)0x0) {
        pBVar7 = (BINDING *)(*(parser->m_mem).malloc_fcn)(0x30);
        if (pBVar7 == (BINDING *)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
        if (0x7fffffe7 < uVar12) {
          return XML_ERROR_NO_MEMORY;
        }
        uVar11 = (uVar11 - (cVar6 == '\0')) + 0x19;
        __dest = (XML_Char *)(*(parser->m_mem).malloc_fcn)(uVar11 & 0xffffffff);
        pBVar7->uri = __dest;
        if (__dest == (XML_Char *)0x0) {
          (*(parser->m_mem).free_fcn)(pBVar7);
          return XML_ERROR_NO_MEMORY;
        }
        pBVar7->uriAlloc = (int)uVar11;
      }
      else {
        if (pBVar7->uriAlloc < (int)uVar12) {
          if (0x7fffffe7 < uVar12) {
            return XML_ERROR_NO_MEMORY;
          }
          uVar11 = (uVar11 - (cVar6 == '\0')) + 0x19;
          __dest = (XML_Char *)(*(parser->m_mem).realloc_fcn)(pBVar7->uri,uVar11 & 0xffffffff);
          if (__dest == (XML_Char *)0x0) {
            return XML_ERROR_NO_MEMORY;
          }
          pBVar7->uri = __dest;
          pBVar7->uriAlloc = (int)uVar11;
        }
        else {
          __dest = pBVar7->uri;
        }
        parser->m_freeBindingList = pBVar7->nextTagBinding;
      }
      pBVar7->uriLen = uVar12;
      uVar13 = uVar13 & 0xffffffff;
      memcpy(__dest,uri,uVar13);
      if (parser->m_namespaceSeparator != '\0') {
        pBVar7->uri[uVar13 - 1] = parser->m_namespaceSeparator;
      }
      pBVar7->prefix = prefix;
      pBVar7->attId = attId;
      pBVar7->prevPrefixBinding = prefix->binding;
      pBVar8 = pBVar7;
      if ((*uri == '\0') && (&parser->m_dtd->defaultPrefix == prefix)) {
        pBVar8 = (BINDING *)0x0;
      }
      prefix->binding = pBVar8;
      pBVar7->nextTagBinding = *bindingsPtr;
      *bindingsPtr = pBVar7;
      XVar10 = XML_ERROR_NONE;
      if ((attId != (ATTRIBUTE_ID *)0x0) &&
         (parser->m_startNamespaceDeclHandler != (XML_StartNamespaceDeclHandler)0x0)) {
        if (prefix->binding == (BINDING *)0x0) {
          uri = (XML_Char *)0x0;
        }
        (*parser->m_startNamespaceDeclHandler)(parser->m_handlerArg,prefix->name,uri);
      }
    }
  }
  return XVar10;
}

Assistant:

static enum XML_Error
addBinding(XML_Parser parser, PREFIX *prefix, const ATTRIBUTE_ID *attId,
           const XML_Char *uri, BINDING **bindingsPtr) {
  // "http://www.w3.org/XML/1998/namespace"
  static const XML_Char xmlNamespace[]
      = {ASCII_h,      ASCII_t,     ASCII_t,     ASCII_p,      ASCII_COLON,
         ASCII_SLASH,  ASCII_SLASH, ASCII_w,     ASCII_w,      ASCII_w,
         ASCII_PERIOD, ASCII_w,     ASCII_3,     ASCII_PERIOD, ASCII_o,
         ASCII_r,      ASCII_g,     ASCII_SLASH, ASCII_X,      ASCII_M,
         ASCII_L,      ASCII_SLASH, ASCII_1,     ASCII_9,      ASCII_9,
         ASCII_8,      ASCII_SLASH, ASCII_n,     ASCII_a,      ASCII_m,
         ASCII_e,      ASCII_s,     ASCII_p,     ASCII_a,      ASCII_c,
         ASCII_e,      '\0'};
  static const int xmlLen = (int)sizeof(xmlNamespace) / sizeof(XML_Char) - 1;
  // "http://www.w3.org/2000/xmlns/"
  static const XML_Char xmlnsNamespace[]
      = {ASCII_h,     ASCII_t,      ASCII_t, ASCII_p, ASCII_COLON,  ASCII_SLASH,
         ASCII_SLASH, ASCII_w,      ASCII_w, ASCII_w, ASCII_PERIOD, ASCII_w,
         ASCII_3,     ASCII_PERIOD, ASCII_o, ASCII_r, ASCII_g,      ASCII_SLASH,
         ASCII_2,     ASCII_0,      ASCII_0, ASCII_0, ASCII_SLASH,  ASCII_x,
         ASCII_m,     ASCII_l,      ASCII_n, ASCII_s, ASCII_SLASH,  '\0'};
  static const int xmlnsLen
      = (int)sizeof(xmlnsNamespace) / sizeof(XML_Char) - 1;

  XML_Bool mustBeXML = XML_FALSE;
  XML_Bool isXML = XML_TRUE;
  XML_Bool isXMLNS = XML_TRUE;

  BINDING *b;
  int len;

  /* empty URI is only valid for default namespace per XML NS 1.0 (not 1.1) */
  if (*uri == XML_T('\0') && prefix->name)
    return XML_ERROR_UNDECLARING_PREFIX;

  if (prefix->name && prefix->name[0] == XML_T(ASCII_x)
      && prefix->name[1] == XML_T(ASCII_m)
      && prefix->name[2] == XML_T(ASCII_l)) {
    /* Not allowed to bind xmlns */
    if (prefix->name[3] == XML_T(ASCII_n) && prefix->name[4] == XML_T(ASCII_s)
        && prefix->name[5] == XML_T('\0'))
      return XML_ERROR_RESERVED_PREFIX_XMLNS;

    if (prefix->name[3] == XML_T('\0'))
      mustBeXML = XML_TRUE;
  }

  for (len = 0; uri[len]; len++) {
    if (isXML && (len > xmlLen || uri[len] != xmlNamespace[len]))
      isXML = XML_FALSE;

    if (! mustBeXML && isXMLNS
        && (len > xmlnsLen || uri[len] != xmlnsNamespace[len]))
      isXMLNS = XML_FALSE;

    // NOTE: While Expat does not validate namespace URIs against RFC 3986
    //       today (and is not REQUIRED to do so with regard to the XML 1.0
    //       namespaces specification) we have to at least make sure, that
    //       the application on top of Expat (that is likely splitting expanded
    //       element names ("qualified names") of form
    //       "[uri sep] local [sep prefix] '\0'" back into 1, 2 or 3 pieces
    //       in its element handler code) cannot be confused by an attacker
    //       putting additional namespace separator characters into namespace
    //       declarations.  That would be ambiguous and not to be expected.
    //
    //       While the HTML API docs of function XML_ParserCreateNS have been
    //       advising against use of a namespace separator character that can
    //       appear in a URI for >20 years now, some widespread applications
    //       are using URI characters (':' (colon) in particular) for a
    //       namespace separator, in practice.  To keep these applications
    //       functional, we only reject namespaces URIs containing the
    //       application-chosen namespace separator if the chosen separator
    //       is a non-URI character with regard to RFC 3986.
    if (parser->m_ns && (uri[len] == parser->m_namespaceSeparator)
        && ! is_rfc3986_uri_char(uri[len])) {
      return XML_ERROR_SYNTAX;
    }
  }
  isXML = isXML && len == xmlLen;
  isXMLNS = isXMLNS && len == xmlnsLen;

  if (mustBeXML != isXML)
    return mustBeXML ? XML_ERROR_RESERVED_PREFIX_XML
                     : XML_ERROR_RESERVED_NAMESPACE_URI;

  if (isXMLNS)
    return XML_ERROR_RESERVED_NAMESPACE_URI;

  if (parser->m_namespaceSeparator)
    len++;
  if (parser->m_freeBindingList) {
    b = parser->m_freeBindingList;
    if (len > b->uriAlloc) {
      /* Detect and prevent integer overflow */
      if (len > INT_MAX - EXPAND_SPARE) {
        return XML_ERROR_NO_MEMORY;
      }

      /* Detect and prevent integer overflow.
       * The preprocessor guard addresses the "always false" warning
       * from -Wtype-limits on platforms where
       * sizeof(unsigned int) < sizeof(size_t), e.g. on x86_64. */
#if UINT_MAX >= SIZE_MAX
      if ((unsigned)(len + EXPAND_SPARE) > (size_t)(-1) / sizeof(XML_Char)) {
        return XML_ERROR_NO_MEMORY;
      }
#endif

      XML_Char *temp = (XML_Char *)REALLOC(
          parser, b->uri, sizeof(XML_Char) * (len + EXPAND_SPARE));
      if (temp == NULL)
        return XML_ERROR_NO_MEMORY;
      b->uri = temp;
      b->uriAlloc = len + EXPAND_SPARE;
    }
    parser->m_freeBindingList = b->nextTagBinding;
  } else {
    b = (BINDING *)MALLOC(parser, sizeof(BINDING));
    if (! b)
      return XML_ERROR_NO_MEMORY;

    /* Detect and prevent integer overflow */
    if (len > INT_MAX - EXPAND_SPARE) {
      return XML_ERROR_NO_MEMORY;
    }
    /* Detect and prevent integer overflow.
     * The preprocessor guard addresses the "always false" warning
     * from -Wtype-limits on platforms where
     * sizeof(unsigned int) < sizeof(size_t), e.g. on x86_64. */
#if UINT_MAX >= SIZE_MAX
    if ((unsigned)(len + EXPAND_SPARE) > (size_t)(-1) / sizeof(XML_Char)) {
      return XML_ERROR_NO_MEMORY;
    }
#endif

    b->uri
        = (XML_Char *)MALLOC(parser, sizeof(XML_Char) * (len + EXPAND_SPARE));
    if (! b->uri) {
      FREE(parser, b);
      return XML_ERROR_NO_MEMORY;
    }
    b->uriAlloc = len + EXPAND_SPARE;
  }
  b->uriLen = len;
  memcpy(b->uri, uri, len * sizeof(XML_Char));
  if (parser->m_namespaceSeparator)
    b->uri[len - 1] = parser->m_namespaceSeparator;
  b->prefix = prefix;
  b->attId = attId;
  b->prevPrefixBinding = prefix->binding;
  /* NULL binding when default namespace undeclared */
  if (*uri == XML_T('\0') && prefix == &parser->m_dtd->defaultPrefix)
    prefix->binding = NULL;
  else
    prefix->binding = b;
  b->nextTagBinding = *bindingsPtr;
  *bindingsPtr = b;
  /* if attId == NULL then we are not starting a namespace scope */
  if (attId && parser->m_startNamespaceDeclHandler)
    parser->m_startNamespaceDeclHandler(parser->m_handlerArg, prefix->name,
                                        prefix->binding ? uri : 0);
  return XML_ERROR_NONE;
}